

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

void __thiscall notch::io::LayerSpec::LayerSpec(LayerSpec *this,ALossLayer *layer)

{
  int iVar1;
  undefined4 extraout_var;
  string tag;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->inputDim = 0;
  this->outputDim = 0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**layer->_vptr_ALossLayer)(local_38);
  std::__cxx11::string::_M_assign((string *)this);
  iVar1 = (*layer->_vptr_ALossLayer[4])(layer);
  this->inputDim = CONCAT44(extraout_var,iVar1);
  this->outputDim = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

LayerSpec(const ALossLayer &layer) {
        std::string tag = layer.tag();
        this->tag = tag;
        this->inputDim = layer.inputDim();
        this->outputDim = 0;
    }